

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::MethodDescriptorProto::MergePartialFromCodedStream
          (MethodDescriptorProto *this,CodedInputStream *input)

{
  uint8 *puVar1;
  bool bVar2;
  uint uVar3;
  string *psVar4;
  MethodOptions *value;
  uint32 tag;
  
LAB_001f5b47:
  do {
    puVar1 = input->buffer_;
    if ((puVar1 < input->buffer_end_) && (tag = (uint32)(char)*puVar1, -1 < (char)*puVar1)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar1 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar3 = tag & 7;
    switch(tag >> 3) {
    case 1:
      if (uVar3 == 2) {
        psVar4 = mutable_name_abi_cxx11_(this);
        bVar2 = internal::WireFormatLite::ReadString(input,psVar4);
        if (!bVar2) {
          return false;
        }
        internal::WireFormat::VerifyUTF8StringFallback
                  ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
        puVar1 = input->buffer_;
        if ((puVar1 < input->buffer_end_) && (*puVar1 == '\x12')) {
          input->buffer_ = puVar1 + 1;
LAB_001f5c1e:
          psVar4 = mutable_input_type_abi_cxx11_(this);
          bVar2 = internal::WireFormatLite::ReadString(input,psVar4);
          if (!bVar2) {
            return false;
          }
          internal::WireFormat::VerifyUTF8StringFallback
                    ((this->input_type_->_M_dataplus)._M_p,(int)this->input_type_->_M_string_length,
                     PARSE);
          puVar1 = input->buffer_;
          if ((puVar1 < input->buffer_end_) && (*puVar1 == '\x1a')) {
            input->buffer_ = puVar1 + 1;
LAB_001f5c68:
            psVar4 = mutable_output_type_abi_cxx11_(this);
            bVar2 = internal::WireFormatLite::ReadString(input,psVar4);
            if (!bVar2) {
              return false;
            }
            internal::WireFormat::VerifyUTF8StringFallback
                      ((this->output_type_->_M_dataplus)._M_p,
                       (int)this->output_type_->_M_string_length,PARSE);
            puVar1 = input->buffer_;
            if ((puVar1 < input->buffer_end_) && (*puVar1 == '\"')) {
              input->buffer_ = puVar1 + 1;
LAB_001f5cae:
              value = mutable_options(this);
              bVar2 = internal::WireFormatLite::
                      ReadMessageNoVirtual<google::protobuf::MethodOptions>(input,value);
              if (!bVar2) {
                return false;
              }
              bVar2 = io::CodedInputStream::ExpectAtEnd(input);
              if (bVar2) {
                return true;
              }
            }
          }
        }
        goto LAB_001f5b47;
      }
      break;
    case 2:
      if (uVar3 == 2) goto LAB_001f5c1e;
      break;
    case 3:
      if (uVar3 == 2) goto LAB_001f5c68;
      break;
    case 4:
      if (uVar3 == 2) goto LAB_001f5cae;
    }
    if (uVar3 == 4) {
      return true;
    }
    bVar2 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool MethodDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_input_type;
        break;
      }

      // optional string input_type = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_input_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_input_type()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->input_type().data(), this->input_type().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_output_type;
        break;
      }

      // optional string output_type = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_output_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_output_type()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->output_type().data(), this->output_type().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(34)) goto parse_options;
        break;
      }

      // optional .google.protobuf.MethodOptions options = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}